

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmldivs.cpp
# Opt level: O2

div_t __thiscall HtmlDivs::div(HtmlDivs *this,int __numer,int __denom)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  QString *line;
  HtmlDivs divs;
  QArrayDataPointer<QString> local_88;
  QArrayDataPointer<char16_t> local_70;
  HtmlDivs local_58;
  
  line = (QString *)CONCAT44(in_register_00000034,__numer);
  local_58.mBackgroundColor.d.d = (Data *)0x0;
  local_58.mBackgroundColor.d.ptr = (char16_t *)0x0;
  local_58.mDivs.d.ptr = (QString *)0x0;
  local_58.mDivs.d.size = 0;
  local_58.mLines.d.size = 0;
  local_58.mDivs.d.d = (Data *)0x0;
  local_58.mLines.d.d = (Data *)0x0;
  local_58.mLines.d.ptr = (QString *)0x0;
  local_58.mBackgroundColor.d.size = 0;
  append(&local_58,line,(QString *)CONCAT44(in_register_00000014,__denom));
  close(&local_58,(int)line);
  local_88.d = local_58.mDivs.d.d;
  local_88.ptr = local_58.mDivs.d.ptr;
  local_88.size = local_58.mDivs.d.size;
  if (local_58.mDivs.d.d != (Data *)0x0) {
    LOCK();
    ((local_58.mDivs.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.mDivs.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::QString((QString *)&local_70,"");
  QListSpecialMethods<QString>::join
            ((QString *)this,(QListSpecialMethods<QString> *)&local_88,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  ~HtmlDivs(&local_58);
  return (div_t)this;
}

Assistant:

QString HtmlDivs::div(const QString &text, const QString &backgroundColor)
{
    HtmlDivs divs;
    divs.append(text, backgroundColor);
    divs.close();
    return divs.divs().join("");
}